

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerGLSL::variable_decl
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRType *type,string *name,uint32_t id
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_50 [8];
  string type_name;
  uint32_t id_local;
  string *name_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  type_name.field_2._12_4_ = id;
  (*(this->super_Compiler)._vptr_Compiler[0x13])((string *)local_50,this,type,(ulong)id);
  Compiler::remap_variable_type_name(&this->super_Compiler,type,name,(string *)local_50);
  (*(this->super_Compiler)._vptr_Compiler[0x26])
            (&local_80,this,type,(ulong)(uint)type_name.field_2._12_4_);
  join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string>
            (__return_storage_ptr__,(spirv_cross *)local_50,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x645fd9,
             (char (*) [2])name,&local_80,in_R9);
  ::std::__cxx11::string::~string((string *)&local_80);
  ::std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::variable_decl(const SPIRType &type, const string &name, uint32_t id)
{
	string type_name = type_to_glsl(type, id);
	remap_variable_type_name(type, name, type_name);
	return join(type_name, " ", name, type_to_array_glsl(type, id));
}